

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# discrete_dist.hpp
# Opt level: O0

void __thiscall
trng::discrete_dist::param_type::update_layer(param_type *this,size_type layer,size_type n)

{
  double dVar1;
  double dVar2;
  value_type vVar3;
  unsigned_long uVar4;
  ulong uVar5;
  reference pvVar6;
  long in_RDX;
  unsigned_long in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  size_type i;
  size_type last;
  size_type first;
  undefined8 local_30;
  
  uVar4 = int_math::pow2<unsigned_long>(in_RSI);
  local_30 = uVar4 - 1;
  uVar5 = local_30 + in_RDX;
  for (; local_30 < uVar5; local_30 = local_30 + 2) {
    if (local_30 + 1 < uVar5) {
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,local_30);
      dVar1 = *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,local_30 + 1);
      dVar2 = *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,local_30 - 1 >> 1);
      *pvVar6 = dVar1 + dVar2;
    }
    else {
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,local_30);
      vVar3 = *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,local_30 - 1 >> 1);
      *pvVar6 = vVar3;
    }
  }
  return;
}

Assistant:

void update_layer(size_type layer, size_type n) {
        const size_type first{int_math::pow2(layer) - 1}, last{first + n};
        for (size_type i{first}; i < last; ++i, ++i)
          if (i + 1 < last)
            P_[(i - 1) / 2] = P_[i] + P_[i + 1];
          else
            P_[(i - 1) / 2] = P_[i];
      }